

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonUI.cpp
# Opt level: O0

void __thiscall nite::ButtonUI::render(ButtonUI *this,Vec2 *offset)

{
  bool bVar1;
  int iVar2;
  RenderableFont *pRVar3;
  RenderableTextureT *pRVar4;
  float fVar5;
  RenderableTextureT *ref_1;
  float local_f0;
  Vec2 is;
  float total;
  RenderableFont *ref;
  Vec2 local_d0;
  Vec2 rp;
  Vec2 *bt;
  undefined1 local_b4 [16];
  undefined1 local_a4 [16];
  undefined1 local_94 [16];
  undefined1 local_84 [16];
  Color tc;
  Color bc;
  Vec2 cs;
  Vec2 p;
  allocator local_39;
  string local_38;
  Vec2 *local_18;
  Vec2 *offset_local;
  ButtonUI *this_local;
  
  local_18 = offset;
  offset_local = (Vec2 *)this;
  if ((render(nite::Vec2_const&)::blank == '\0') &&
     (iVar2 = __cxa_guard_acquire(&render(nite::Vec2_const&)::blank), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"data/texture/empty.png",&local_39);
    Texture::Texture(&render::blank,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    __cxa_atexit(Texture::~Texture,&render::blank,&__dso_handle);
    __cxa_guard_release(&render(nite::Vec2_const&)::blank);
  }
  Vec2::Vec2(&cs,(this->super_BaseUIComponent).position.x + local_18->x,
             (this->super_BaseUIComponent).position.y + local_18->y);
  Vec2::operator+((Vec2 *)&bc.b,&(this->super_BaseUIComponent).size);
  Color::Color((Color *)&tc.b,&this->baseColor);
  Color::Color((Color *)(local_84 + 8),&this->textColor);
  if (this->buttonState == 1) {
    Color::operator*((Color *)(local_94 + 8),0.5);
    tc.b = (float)local_94._8_4_;
    tc.a = (float)local_94._12_4_;
    bc.r = (float)local_84._0_4_;
    bc.g = (float)local_84._4_4_;
    Color::operator*((Color *)(local_a4 + 8),0.5);
    local_84._8_8_ = local_a4._8_8_;
    tc.r = (float)local_94._0_4_;
    tc.g = (float)local_94._4_4_;
  }
  if (this->buttonState == 2) {
    Color::operator*((Color *)(local_b4 + 8),1.0);
    tc.b = (float)local_b4._8_4_;
    tc.a = (float)local_b4._12_4_;
    bc.r = (float)local_a4._0_4_;
    bc.g = (float)local_a4._4_4_;
    Color::operator*((Color *)((long)&bt + 4),1.0);
    local_84._8_8_ = stack0xffffffffffffff44;
    tc.r = (float)local_b4._0_4_;
    tc.g = (float)local_b4._4_4_;
  }
  rp = (Vec2)&this->borderThickness;
  Vec2::operator*(&local_d0,0.5);
  fVar5 = (this->secondColor).a;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    Color::Color((Color *)&ref,&this->secondColor);
  }
  else {
    Color::operator*((Color *)&ref,0.95);
  }
  setColor((Color *)&ref);
  Texture::draw(&render::blank,cs.x - local_d0.x,cs.y - local_d0.y,bc.b,bc.a,0.0,0.0,0.0);
  setColor((Color *)&tc.b);
  Texture::draw(&render::blank,(cs.x - local_d0.x) + *(float *)rp,
                (cs.y - local_d0.y) + *(float *)((long)rp + 4),-*(float *)rp + -*(float *)rp + bc.b,
                -*(float *)((long)rp + 4) + -*(float *)((long)rp + 4) + bc.a,0.0,0.0,0.0);
  bVar1 = Texture::isLoaded(&this->buttonImage);
  if (bVar1) {
    fVar5 = Vec2::avg(&(this->super_BaseUIComponent).size);
    is.x = fVar5 * 0.65;
    Texture::getSize((Texture *)((long)&ref_1 + 4));
    while (fVar5 = Vec2::avg((Vec2 *)((long)&ref_1 + 4)), is.x < fVar5) {
      ref_1._4_4_ = ref_1._4_4_ * 0.9;
      local_f0 = local_f0 * 0.9;
    }
    setColor((Color *)(local_84 + 8));
    pRVar4 = Texture::draw(&this->buttonImage,cs.x,-local_f0 * 0.09 + cs.y,ref_1._4_4_,local_f0,0.5,
                           0.5,0.0);
    if (pRVar4 != (RenderableTextureT *)0x0) {
      pRVar4->smooth = true;
    }
  }
  else {
    setColor((Color *)(local_84 + 8));
    pRVar3 = Font::draw(&this->font,&this->text,cs.x,cs.y,0.5,0.35,0.0);
    if (pRVar3 != (RenderableFont *)0x0) {
      pRVar3->shadow = false;
    }
  }
  return;
}

Assistant:

void nite::ButtonUI::render(const nite::Vec2 &offset){
    static nite::Texture blank("data/texture/empty.png");
    nite::Vec2 p(position.x + offset.x, position.y + offset.y);
    // nite::print(padding);
    auto cs = size + padding;
    nite::Color bc = baseColor;
    nite::Color tc = textColor;
    if(buttonState == 1){
        bc = baseColor * 0.5f;
        tc = textColor * 0.5f;
    }
    if(buttonState == 2){
        bc = baseColor * 1.0f;
        tc = textColor * 1.0f;
    }
    nite::Vec2 &bt = borderThickness;
    nite::Vec2 rp(cs * 0.5f);
    //   nite::setColor(nite::Color(0.0f, 0.5f));
    //   blank.draw(p.x - rp.x + 3.0f, p.y - rp.y + 3.0f, cs.x, cs.y, 0.0f, 0.0f, 0.0f);
    nite::setColor(secondColor.a == 0.0f ? baseColor * 0.95f : secondColor);  
    blank.draw(p.x - rp.x, p.y - rp.y, cs.x, cs.y, 0.0f, 0.0f, 0.0f);
    nite::setColor(bc);  
    blank.draw(p.x - rp.x + bt.x, p.y - rp.y + bt.y, cs.x - bt.x * 2.0f, cs.y - bt.y * 2.0f, 0.0f, 0.0f, 0.0f);
    //   blank.draw(p.x - rp.x, p.y - rp.y, cs.x, cs.y, 0.0f, 0.0f, 0.0f);  

    if(!buttonImage.isLoaded()){
        nite::setColor(tc);  
        auto *ref = font.draw(text, p.x, p.y, 0.5f, 0.35f, 0.0f);
        if(ref != NULL){
            ref->shadow = false;
            // nite::Color sc = bc.invert();
            // ref->setShadow(nite::Color(sc.r, sc.g, sc.b, 1.0f), nite::Vec2(1.0f));
        }  	
    }else{
        auto total = size.avg() * 0.65f;
        nite::Vec2 is(buttonImage.getSize());
        while(is.avg() > total){
            is.x *= 0.90f;
            is.y *= 0.90f;
        }
        nite::setColor(tc); 
        auto *ref = buttonImage.draw(p.x, p.y - is.y * 0.09f, is.x, is.y, 0.5f, 0.5f, 0.0f);
        if(ref != NULL){
            ref->smooth = true;
        }
    }
}